

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonSplitFormatter.cpp
# Opt level: O0

ostream * __thiscall anon_unknown.dwarf_1996e5::Hierarchy::write_nodes(Hierarchy *this,ostream *os)

{
  HierarchyNode *this_00;
  lock_guard<std::mutex> lVar1;
  bool bVar2;
  reference ppHVar3;
  ostream *os_00;
  char *pcVar4;
  HierarchyNode *node;
  iterator __end2;
  iterator __begin2;
  vector<(anonymous_namespace)::Hierarchy::HierarchyNode_*,_std::allocator<(anonymous_namespace)::Hierarchy::HierarchyNode_*>_>
  *__range2;
  int count;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> g;
  ostream *os_local;
  Hierarchy *this_local;
  
  g._M_device = (mutex_type *)os;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_nodes_lock);
  std::operator<<((ostream *)g._M_device,"\"nodes\": [");
  __range2._0_4_ = 0;
  __end2 = std::
           vector<(anonymous_namespace)::Hierarchy::HierarchyNode_*,_std::allocator<(anonymous_namespace)::Hierarchy::HierarchyNode_*>_>
           ::begin(&this->m_nodes);
  node = (HierarchyNode *)
         std::
         vector<(anonymous_namespace)::Hierarchy::HierarchyNode_*,_std::allocator<(anonymous_namespace)::Hierarchy::HierarchyNode_*>_>
         ::end(&this->m_nodes);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<(anonymous_namespace)::Hierarchy::HierarchyNode_**,_std::vector<(anonymous_namespace)::Hierarchy::HierarchyNode_*,_std::allocator<(anonymous_namespace)::Hierarchy::HierarchyNode_*>_>_>
                                *)&node);
    if (!bVar2) break;
    ppHVar3 = __gnu_cxx::
              __normal_iterator<(anonymous_namespace)::Hierarchy::HierarchyNode_**,_std::vector<(anonymous_namespace)::Hierarchy::HierarchyNode_*,_std::allocator<(anonymous_namespace)::Hierarchy::HierarchyNode_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppHVar3;
    pcVar4 = " ";
    if (0 < (int)__range2) {
      pcVar4 = ", ";
    }
    os_00 = std::operator<<((ostream *)g._M_device,pcVar4);
    HierarchyNode::write_json(this_00,os_00);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::Hierarchy::HierarchyNode_**,_std::vector<(anonymous_namespace)::Hierarchy::HierarchyNode_*,_std::allocator<(anonymous_namespace)::Hierarchy::HierarchyNode_*>_>_>
    ::operator++(&__end2);
    __range2._0_4_ = (int)__range2 + 1;
  }
  std::operator<<((ostream *)g._M_device," ]");
  lVar1 = g;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (ostream *)lVar1._M_device;
}

Assistant:

std::ostream& write_nodes(std::ostream& os)
    {
        std::lock_guard<std::mutex> g(m_nodes_lock);

        os << "\"nodes\": [";

        int count = 0;
        for (const HierarchyNode* node : m_nodes)
            node->write_json(os << (count++ > 0 ? ", " : " "));

        os << " ]";

        return os;
    }